

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

S2Point * __thiscall
S2Builder::SnapSite(S2Point *__return_storage_ptr__,S2Builder *this,S2Point *point)

{
  S2Error *this_00;
  bool bVar1;
  SnapFunction *pSVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  S1Angle local_40;
  S1Angle local_38;
  double local_30;
  double local_28;
  S1ChordAngle local_20;
  S1ChordAngle dist_moved;
  S2Point *point_local;
  S2Builder *this_local;
  
  if ((this->snapping_requested_ & 1U) == 0) {
    __return_storage_ptr__->c_[0] = point->c_[0];
    __return_storage_ptr__->c_[1] = point->c_[1];
    __return_storage_ptr__->c_[2] = point->c_[2];
  }
  else {
    dist_moved.length2_ = (double)point;
    pSVar2 = Options::snap_function(&this->options_);
    (*pSVar2->_vptr_SnapFunction[5])(__return_storage_ptr__,pSVar2,dist_moved.length2_);
    S1ChordAngle::S1ChordAngle(&local_20,__return_storage_ptr__,(S2Point *)dist_moved.length2_);
    local_28 = local_20.length2_;
    local_30 = (this->site_snap_radius_ca_).length2_;
    bVar1 = operator>(local_20,(S1ChordAngle)local_30);
    if (bVar1) {
      this_00 = this->error_;
      dVar3 = Vector3<double>::x(dist_moved.length2_);
      dVar4 = Vector3<double>::y(dist_moved.length2_);
      dVar5 = Vector3<double>::z(dist_moved.length2_);
      local_38 = S1ChordAngle::ToAngle(&local_20);
      dVar6 = S1Angle::radians(&local_38);
      local_40 = S1ChordAngle::ToAngle(&this->site_snap_radius_ca_);
      dVar7 = S1Angle::radians(&local_40);
      S2Error::Init(this_00,BUILDER_SNAP_RADIUS_TOO_SMALL,
                    "Snap function moved vertex (%.15g, %.15g, %.15g) by %.15g, which is more than the specified snap radius of %.15g"
                    ,dVar3,dVar4,dVar5,dVar6,SUB84(dVar7,0));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

S2Point S2Builder::SnapSite(const S2Point& point) const {
  if (!snapping_requested_) return point;
  S2Point site = options_.snap_function().SnapPoint(point);
S1ChordAngle dist_moved(site, point);
  if (dist_moved > site_snap_radius_ca_) {
    error_->Init(S2Error::BUILDER_SNAP_RADIUS_TOO_SMALL,
                 "Snap function moved vertex (%.15g, %.15g, %.15g) "
                 "by %.15g, which is more than the specified snap "
                 "radius of %.15g", point.x(), point.y(), point.z(),
                 dist_moved.ToAngle().radians(),
                 site_snap_radius_ca_.ToAngle().radians());
  }
  return site;
}